

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClassPropertyDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassPropertyDeclarationSyntax,slang::syntax::ClassPropertyDeclarationSyntax_const&>
          (BumpAllocator *this,ClassPropertyDeclarationSyntax *args)

{
  ClassPropertyDeclarationSyntax *pCVar1;
  ClassPropertyDeclarationSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pCVar1 = (ClassPropertyDeclarationSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ClassPropertyDeclarationSyntax::ClassPropertyDeclarationSyntax(in_RSI,pCVar1);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }